

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O0

int nullcInitDynamicModule(void)

{
  bool bVar1;
  int iVar2;
  undefined1 local_28 [8];
  TraceScope traceScope;
  
  if (nullcInitDynamicModule::token == '\0') {
    iVar2 = __cxa_guard_acquire(&nullcInitDynamicModule::token);
    if (iVar2 != 0) {
      nullcInitDynamicModule::token = NULLC::TraceGetToken("nullc","nullcInitDynamicModule");
      __cxa_guard_release(&nullcInitDynamicModule::token);
    }
  }
  NULLC::TraceScope::TraceScope((TraceScope *)local_28,nullcInitDynamicModule::token);
  bVar1 = nullcInitDynamicModule(NULLC::linker);
  NULLC::TraceScope::~TraceScope((TraceScope *)local_28);
  return (uint)bVar1;
}

Assistant:

int nullcInitDynamicModule()
{
	TRACE_SCOPE("nullc", "nullcInitDynamicModule");

	return nullcInitDynamicModule(NULLC::linker);
}